

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O2

bool __thiscall
libebml::EbmlMaster::InsertElement(EbmlMaster *this,EbmlElement *element,EbmlElement *before)

{
  EbmlElement **ppEVar1;
  const_iterator __position;
  EbmlElement *local_18;
  
  ppEVar1 = (this->ElementList).
            super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (__position._M_current =
            (this->ElementList).
            super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
      (__position._M_current != ppEVar1 && (*__position._M_current != before));
      __position._M_current = __position._M_current + 1) {
  }
  if (__position._M_current != ppEVar1) {
    local_18 = element;
    std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::_M_insert_rval
              (&this->ElementList,__position,&local_18);
  }
  return __position._M_current != ppEVar1;
}

Assistant:

bool EbmlMaster::InsertElement(EbmlElement & element, const EbmlElement & before)
{
  std::vector<EbmlElement *>::iterator Itr = ElementList.begin();
  while (Itr != ElementList.end() && *Itr != &before)
  {
    ++Itr;
  }
  if (Itr == ElementList.end())
    return false;

  ElementList.insert(Itr, &element);
  return true;
}